

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

void __thiscall
ktx::ValidationContext::validateKTXmetalPixelFormat
          (ValidationContext *this,uint8_t *data,uint32_t size)

{
  uint uVar1;
  uint32_t local_3c;
  string local_38;
  
  this->foundKTXmetalPixelFormat = true;
  uVar1 = (this->header).vkFormat;
  local_3c = size;
  if (uVar1 != 0) {
    toString_abi_cxx11_(&local_38,(ktx *)(ulong)uVar1,size);
    error<std::__cxx11::string>(this,&Metadata::KTXmetalPixelFormatWithVkFormat,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  if (size != 4) {
    error<unsigned_int&>(this,&Metadata::KTXmetalPixelFormatInvalidSize,&local_3c);
  }
  return;
}

Assistant:

void ValidationContext::validateKTXmetalPixelFormat(const uint8_t* data, uint32_t size) {
    (void) data;
    foundKTXmetalPixelFormat = true;

    if (header.vkFormat != VK_FORMAT_UNDEFINED)
        error(Metadata::KTXmetalPixelFormatWithVkFormat, toString(VkFormat(header.vkFormat)));

    if (size != 4)
        error(Metadata::KTXmetalPixelFormatInvalidSize, size);
}